

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
I2sSimulationDataGenerator::I2sSimulationDataGenerator(I2sSimulationDataGenerator *this)

{
  SimulationChannelDescriptorGroup::SimulationChannelDescriptorGroup(&this->mSimulationChannels);
  (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mSineWaveSamplesRight).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSineWaveSamplesRight).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSineWaveSamplesRight).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ClockGenerator::ClockGenerator(&this->mClockGenerator);
  (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBitMasks).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBitMasks).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBitMasks).super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mAudioSampleRate = 3520.0;
  this->mUseShortFrames = false;
  this->mNumPaddingBits = 0;
  return;
}

Assistant:

I2sSimulationDataGenerator::I2sSimulationDataGenerator()
    : mNumPaddingBits( 0 ),
      /*mAudioSampleRate( 44000*2 ),*/
      mAudioSampleRate( 220 * 16 ),
      mUseShortFrames( false )
{
}